

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  u8 uVar1;
  u8 eMode;
  sqlite3 *db;
  Index *pIVar2;
  u16 nPk;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Table *pTab;
  Trigger *pTrigger;
  Index **ppIVar7;
  Vdbe *p;
  WhereInfo *pWVar8;
  char *zP4;
  u8 *aToOpen;
  VTable *zP4_00;
  Parse *pPVar9;
  uint p2;
  ulong uVar10;
  Expr *pLimit_00;
  int in_R9D;
  ulong uVar11;
  char cVar12;
  undefined4 uVar13;
  Index **ppIVar14;
  Vdbe *pVVar15;
  bool bVar16;
  uint local_100;
  int local_f0;
  Index *local_e8;
  int iDataCur;
  ulong local_c0;
  ulong local_b8;
  int local_b0;
  int iIdxCur;
  Trigger *local_a8;
  Expr *local_a0;
  WhereInfo *local_98;
  ulong local_90;
  char *local_88;
  Parse *local_80;
  ulong local_78;
  ulong local_70;
  NameContext local_68;
  
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  aToOpen = (u8 *)0x0;
  local_a0 = pWhere;
  if (pParse->nErr != 0) goto LAB_0015b132;
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab != (Table *)0x0) {
    pTrigger = sqlite3TriggersExist(pParse,pTab,0x80,(ExprList *)0x0,(int *)0x0);
    uVar1 = pTab->eTabType;
    bVar16 = true;
    if (pTrigger == (Trigger *)0x0) {
      iVar3 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
      bVar16 = iVar3 != 0;
    }
    iVar3 = sqlite3ViewGetColumnNames(pParse,pTab);
    if ((iVar3 == 0) && (iVar3 = sqlite3IsReadOnly(pParse,pTab,pTrigger), iVar3 == 0)) {
      local_a8 = pTrigger;
      iVar3 = sqlite3SchemaToIndex(db,pTab->pSchema);
      pLimit_00 = (Expr *)db->aDb[iVar3].zDbSName;
      aToOpen = (u8 *)0x0;
      iVar4 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,(char *)pLimit_00);
      if (iVar4 == 1) goto LAB_0015b132;
      uVar6 = pParse->nTab;
      local_c0 = (ulong)uVar6;
      pParse->nTab = uVar6 + 1;
      pTabList->a[0].iCursor = uVar6;
      pVVar15 = (Vdbe *)0x2;
      ppIVar14 = &pTab->pIndex;
      ppIVar7 = ppIVar14;
      while (pIVar2 = *ppIVar7, pIVar2 != (Index *)0x0) {
        pParse->nTab = uVar6 + (int)pVVar15;
        pVVar15 = (Vdbe *)((long)&pVVar15->db + 1);
        ppIVar7 = &pIVar2->pNext;
      }
      if (uVar1 == '\x02') {
        local_88 = pParse->zAuthContext;
        pParse->zAuthContext = pTab->zName;
        local_80 = pParse;
      }
      else {
        local_80 = (Parse *)0x0;
        local_88 = (char *)0x0;
      }
      p = sqlite3GetVdbe(pParse);
      if (p == (Vdbe *)0x0) {
LAB_0015b2d1:
        aToOpen = (u8 *)0x0;
      }
      else {
        if (pParse->nested == '\0') {
          p->field_0xc8 = p->field_0xc8 | 0x10;
        }
        sqlite3BeginWriteOperation(pParse,(uint)bVar16,iVar3);
        if (uVar1 == '\x02') {
          iVar5 = (int)local_c0;
          sqlite3MaterializeView
                    (pParse,pTab,local_a0,(ExprList *)(local_c0 & 0xffffffff),pLimit_00,in_R9D);
          iDataCur = iVar5;
          iIdxCur = iVar5;
        }
        local_68.pWinSelect = (Select *)0x0;
        local_68.nRef = 0;
        local_68.nNcErr = 0;
        local_68.ncFlags = 0;
        local_68.nNestedSelect = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pParse = pParse;
        local_68.pSrcList = pTabList;
        iVar5 = sqlite3ResolveExprNames(&local_68,local_a0);
        uVar10 = 0;
        if (iVar5 != 0) goto LAB_0015b2d1;
        local_b8 = uVar10;
        if (((((db->flags & 0x100000000) != 0) && (pParse->nested == '\0')) &&
            (pParse->pTriggerTab == (Table *)0x0)) && (local_b8 = 0, pParse->bReturning == '\0')) {
          p2 = pParse->nMem + 1;
          local_b8 = (ulong)p2;
          pParse->nMem = p2;
          sqlite3VdbeAddOp2(p,0x47,0,p2);
        }
        if (((local_a0 == (Expr *)0x0 && iVar4 == 0) && bVar16 == 0) && (pTab->eTabType != '\x01'))
        {
          sqlite3TableLock(pParse,iVar3,pTab->tnum,'\x01',pTab->zName);
          if ((pTab->tabFlags & 0x80) == 0) {
            sqlite3VdbeAddOp4(p,0x91,pTab->tnum,iVar3,-(uint)((uint)local_b8 == 0) | (uint)local_b8,
                              pTab->zName,-1);
          }
          aToOpen = (u8 *)0x0;
          uVar6 = (uint)local_b8;
          while (pIVar2 = *ppIVar14, pIVar2 != (Index *)0x0) {
            if (((*(ushort *)&pIVar2->field_0x63 & 3) == 2) && ((pTab->tabFlags & 0x80) != 0)) {
              sqlite3VdbeAddOp3(p,0x91,pIVar2->tnum,iVar3,-(uint)(uVar6 == 0) | uVar6);
            }
            else {
              sqlite3VdbeAddOp2(p,0x91,pIVar2->tnum,iVar3);
            }
            ppIVar14 = &pIVar2->pNext;
          }
LAB_0015ba69:
          iVar3 = (int)local_b8;
          if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
            sqlite3AutoincrementEnd(pParse);
            iVar3 = (int)local_b8;
          }
          if (iVar3 != 0) {
            sqlite3CodeChangeCount(p,iVar3,"rows deleted");
          }
        }
        else {
          uVar10 = local_68._40_8_ & 0x40;
          if ((pTab->tabFlags & 0x80) == 0) {
            local_b0 = pParse->nMem + 1;
            pParse->nMem = local_b0;
            local_e8 = (Index *)0x0;
            sqlite3VdbeAddOp2(p,0x4b,0,local_b0);
            nPk = 1;
            local_100 = 0;
            iVar3 = 0;
            local_f0 = 0;
          }
          else {
            local_e8 = sqlite3PrimaryKeyIndex(pTab);
            nPk = local_e8->nKeyCol;
            iVar3 = pParse->nTab;
            local_100 = pParse->nMem + 1;
            pParse->nMem = pParse->nMem + (int)(short)nPk;
            pParse->nTab = iVar3 + 1;
            local_f0 = sqlite3VdbeAddOp2(p,0x76,iVar3,(int)(short)nPk);
            sqlite3VdbeSetP4KeyInfo(pParse,local_e8);
            local_b0 = 0;
          }
          aToOpen = (u8 *)0x0;
          pWVar8 = sqlite3WhereBegin(pParse,pTabList,local_a0,(ExprList *)0x0,(ExprList *)0x0,
                                     (Select *)0x0,(ushort)(uVar10 == 0 & (bVar16 ^ 1U)) * 8 + 0x14,
                                     uVar6 + 1);
          if (pWVar8 != (WhereInfo *)0x0) {
            uVar10 = *(ulong *)pWVar8->aiCurOnePass;
            eMode = pWVar8->eOnePass;
            if (eMode != '\x01') {
              pPVar9 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar9 = pParse;
              }
              pPVar9->isMultiWrite = '\x01';
            }
            local_98 = pWVar8;
            if ((pWVar8->field_0x44 & 1) != 0) {
              sqlite3VdbeAddOp1(p,0x8f,(int)local_c0);
            }
            local_90 = uVar10 >> 0x20;
            local_70 = uVar10;
            if ((int)local_b8 != 0) {
              sqlite3VdbeAddOp2(p,0x56,(int)local_b8,1);
            }
            if (local_e8 == (Index *)0x0) {
              local_100 = pParse->nMem + 1;
              pParse->nMem = local_100;
              sqlite3VdbeAddOp2(p,0x87,(int)local_c0,local_100);
              if (eMode == '\0') {
                sqlite3VdbeAddOp2(p,0x9c,local_b0,local_100);
                nPk = 1;
                goto LAB_0015b7af;
              }
LAB_0015b6d1:
              aToOpen = (u8 *)sqlite3DbMallocRawNN(db,(u64)pVVar15);
              if (aToOpen == (u8 *)0x0) {
                sqlite3WhereEnd(local_98);
                goto LAB_0015b2d1;
              }
              memset(aToOpen,1,(size_t)((long)&pVVar15[-1].pAuxData + 7));
              (aToOpen + -1)[(long)pVVar15] = '\0';
              if (-1 < (int)local_70) {
                aToOpen[(int)local_70 - (int)local_c0] = '\0';
              }
              if (-1 < (long)local_70) {
                aToOpen[(int)local_90 - (int)local_c0] = '\0';
              }
              if (local_f0 != 0) {
                sqlite3VdbeChangeToNoop(p,local_f0);
              }
              iVar4 = pParse->nLabel + -1;
              pParse->nLabel = iVar4;
              if (uVar1 != '\x02') {
                if (eMode != '\x02') {
                  bVar16 = false;
                  goto LAB_0015b7e8;
                }
                local_f0 = sqlite3VdbeAddOp0(p,0xf);
                pVVar15 = (Vdbe *)0x1;
                bVar16 = false;
LAB_0015b7f0:
                sqlite3OpenTableAndIndices
                          (pParse,pTab,0x71,'\b',(int)local_c0,aToOpen,&iDataCur,&iIdxCur);
                if ((char)pVVar15 != '\0') {
                  sqlite3VdbeJumpHereOrPopInst(p,local_f0);
                }
                if (bVar16) goto LAB_0015b831;
              }
              iVar5 = 0;
              if (pTab->eTabType != '\x01') {
                if (aToOpen[iDataCur - (int)local_c0] != '\0') {
                  sqlite3VdbeAddOp4Int(p,0x1c,iDataCur,iVar4,local_100,(int)(short)nPk);
                }
                uVar13 = 0;
                iVar5 = 0;
                goto LAB_0015b912;
              }
              local_a8 = (Trigger *)((ulong)local_a8 & 0xffffffff00000000);
LAB_0015b921:
              zP4_00 = sqlite3GetVTable(db,pTab);
              sqlite3VtabMakeWritable(pParse,pTab);
              pPVar9 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar9 = pParse;
              }
              pPVar9->mayAbort = '\x01';
              if ((eMode == '\x01') &&
                 (sqlite3VdbeAddOp1(p,0x7a,(int)local_c0), pParse->pToplevel == (Parse *)0x0)) {
                pParse->isMultiWrite = '\0';
              }
              sqlite3VdbeAddOp4(p,7,0,1,local_100,(char *)zP4_00,-0xb);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
              cVar12 = (char)local_a8;
            }
            else {
              uVar6 = (uint)(short)nPk;
              local_78 = (ulong)uVar6;
              uVar11 = 0;
              uVar10 = 0;
              if (0 < (int)uVar6) {
                uVar10 = (ulong)uVar6;
              }
              for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
                sqlite3ExprCodeGetColumnOfTable
                          (p,pTab,(int)local_c0,(int)local_e8->aiColumn[uVar11],
                           local_100 + (int)uVar11);
              }
              if (eMode != '\0') goto LAB_0015b6d1;
              uVar6 = pParse->nMem + 1;
              pVVar15 = (Vdbe *)(ulong)uVar6;
              pParse->nMem = uVar6;
              zP4 = sqlite3IndexAffinityStr(pParse->db,local_e8);
              iVar4 = (int)local_78;
              sqlite3VdbeAddOp4(p,0x61,local_100,iVar4,uVar6,zP4,iVar4);
              sqlite3VdbeAddOp4Int(p,0x8a,iVar3,uVar6,local_100,iVar4);
              nPk = 0;
              local_100 = uVar6;
LAB_0015b7af:
              sqlite3WhereEnd(local_98);
              aToOpen = (u8 *)0x0;
              if (uVar1 != '\x02') {
                bVar16 = true;
                iVar4 = 0;
LAB_0015b7e8:
                pVVar15 = (Vdbe *)0x0;
                local_f0 = 0;
                goto LAB_0015b7f0;
              }
              iVar4 = 0;
LAB_0015b831:
              if (local_e8 == (Index *)0x0) {
                iVar5 = sqlite3VdbeAddOp3(p,0x2e,local_b0,0,local_100);
              }
              else {
                iVar5 = sqlite3VdbeAddOp1(p,0x24,iVar3);
                pVVar15 = p;
                if (pTab->eTabType == '\x01') {
                  sqlite3VdbeAddOp3(p,0x5e,iVar3,0,local_100);
                }
                else {
                  sqlite3VdbeAddOp2(p,0x86,iVar3,local_100);
                }
              }
              uVar13 = (undefined4)CONCAT71((int7)((ulong)pVVar15 >> 8),1);
LAB_0015b912:
              if (pTab->eTabType == '\x01') {
                local_a8 = (Trigger *)CONCAT44(local_a8._4_4_,uVar13);
                goto LAB_0015b921;
              }
              sqlite3GenerateRowDelete
                        (pParse,pTab,local_a8,iDataCur,iIdxCur,local_100,nPk,pParse->nested == '\0',
                         '\v',eMode,(int)local_90);
              cVar12 = (char)uVar13;
            }
            if (cVar12 == '\0') {
              sqlite3VdbeResolveLabel(p,iVar4);
              sqlite3WhereEnd(local_98);
            }
            else {
              if (local_e8 == (Index *)0x0) {
                sqlite3VdbeGoto(p,iVar5);
              }
              else {
                sqlite3VdbeAddOp2(p,0x27,iVar3,iVar5 + 1);
              }
              sqlite3VdbeJumpHere(p,iVar5);
            }
            goto LAB_0015ba69;
          }
        }
      }
      if (local_80 != (Parse *)0x0) {
        local_80->zAuthContext = local_88;
      }
      goto LAB_0015b132;
    }
  }
  aToOpen = (u8 *)0x0;
LAB_0015b132:
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprDelete(db,local_a0);
  if (aToOpen != (u8 *)0x0) {
    sqlite3DbNNFreeNN(db,aToOpen);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto delete_from_cleanup;
  }
  assert( db->mallocFailed==0 );
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = IsView(pTab);
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x10000 ){
    sqlite3TreeViewLine(0, "In sqlite3Delete() at %s:%d", __FILE__, __LINE__);
    sqlite3TreeViewDelete(pParse->pWith, pTabList, pWhere,
                          pOrderBy, pLimit, pTrigger);
  }
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, pTrigger) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0,
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab,
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
   && !pParse->bReturning
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Clear, pIdx->tnum, iDb, memCnt ? memCnt : -1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
      }
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK;
    if( sNC.ncFlags & NC_Subquery ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      assert( nPk==1 );
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }

    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0,0,wcf,iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF
            || OptimizationDisabled(db, SQLITE_OnePass) );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
    if( sqlite3WhereUsesDeferredSeek(pWInfo) ){
      sqlite3VdbeAddOp1(v, OP_FinishSeek, iTabCur);
    }

    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }

    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }

    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
      sqlite3WhereEnd(pWInfo);
    }

    /* Unless this is a view, open cursors for the table we are
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ){
        sqlite3VdbeJumpHereOrPopInst(v, iAddrOnce);
      }
    }

    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || IsView(pTab) );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }

    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3CodeChangeCount(v, memCnt, "rows deleted");
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  if( aToOpen ) sqlite3DbNNFreeNN(db, aToOpen);
  return;
}